

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDarCleanupAig(Abc_Ntk_t *pNtk,int fCleanupPis,int fCleanupPos,int fVerbose)

{
  uint uVar1;
  Aig_Man_t *p;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  Aig_Man_t *pAVar4;
  
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    return (Abc_Ntk_t *)0x0;
  }
  if (fCleanupPis != 0) {
    pAVar4 = p;
    uVar1 = Aig_ManCiCleanup(p);
    if (fVerbose == 0) {
      if (fCleanupPos != 0) {
        Aig_ManCoCleanup(p);
      }
      goto LAB_0024ff52;
    }
    Abc_Print((int)pAVar4,"Cleanup removed %d primary inputs without fanout.\n",(ulong)uVar1);
  }
  if ((fCleanupPos != 0) && (pAVar4 = p, uVar1 = Aig_ManCoCleanup(p), fVerbose != 0)) {
    Abc_Print((int)pAVar4,"Cleanup removed %d primary outputs driven by const-0.\n",(ulong)uVar1);
  }
LAB_0024ff52:
  pAVar2 = Abc_NtkFromAigPhase(p);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pAVar2->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
  pAVar2->pSpec = pcVar3;
  Aig_ManStop(p);
  return pAVar2;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarCleanupAig( Abc_Ntk_t * pNtk, int fCleanupPis, int fCleanupPos, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
    if ( fCleanupPis )
    {
        int Temp = Aig_ManCiCleanup( pMan );
        if ( fVerbose )
            Abc_Print( 1, "Cleanup removed %d primary inputs without fanout.\n", Temp );                                                                     
    }
    if ( fCleanupPos )
    {
        int Temp = Aig_ManCoCleanup( pMan );
        if ( fVerbose )
            Abc_Print( 1, "Cleanup removed %d primary outputs driven by const-0.\n", Temp );                                                                     
    }
    pNtkAig = Abc_NtkFromAigPhase( pMan );
    pNtkAig->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkAig->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Aig_ManStop( pMan );
    return pNtkAig;
}